

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

string * google::protobuf::UnescapeCEscapeString(string *__return_storage_ptr__,string *src)

{
  long lVar1;
  char *pcVar2;
  char *dest;
  ulong uVar3;
  allocator local_35 [17];
  int local_24;
  int len;
  scoped_array<char> unescaped;
  string *src_local;
  
  unescaped.array_ = (char *)src;
  lVar1 = std::__cxx11::string::size();
  pcVar2 = (char *)operator_new__(lVar1 + 1);
  internal::scoped_array<char>::scoped_array((scoped_array<char> *)&stack0xffffffffffffffe0,pcVar2);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  dest = internal::scoped_array<char>::get((scoped_array<char> *)&stack0xffffffffffffffe0);
  local_24 = UnescapeCEscapeSequences
                       (pcVar2,dest,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0);
  pcVar2 = internal::scoped_array<char>::get((scoped_array<char> *)&stack0xffffffffffffffe0);
  uVar3 = (ulong)local_24;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar3,local_35);
  std::allocator<char>::~allocator((allocator<char> *)local_35);
  internal::scoped_array<char>::~scoped_array((scoped_array<char> *)&stack0xffffffffffffffe0);
  return __return_storage_ptr__;
}

Assistant:

string UnescapeCEscapeString(const string& src) {
  scoped_array<char> unescaped(new char[src.size() + 1]);
  int len = UnescapeCEscapeSequences(src.c_str(), unescaped.get(), NULL);
  return string(unescaped.get(), len);
}